

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_tt_GetGlyphShape(nk_tt_fontinfo *info,nk_allocator *alloc,int glyph_index,
                       nk_tt_vertex **pvertices)

{
  ushort *puVar1;
  nk_tt_vertex *pnVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  uchar *puVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  nk_int cx;
  nk_int cy;
  ushort uVar11;
  uint uVar12;
  int num_vertices;
  int iVar13;
  ulong uVar14;
  nk_tt_vertex *vertices;
  ushort *puVar15;
  nk_size nVar16;
  nk_tt_vertex *dst0;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  short sVar20;
  int was_off;
  int iVar21;
  int iVar22;
  long lVar23;
  byte bVar24;
  short sVar25;
  byte bVar26;
  int sx;
  int sy;
  ushort uVar27;
  int iVar28;
  nk_int nVar29;
  int iVar30;
  nk_int nVar31;
  float fVar32;
  float fVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  ushort *local_d8;
  nk_tt_vertex *comp_verts;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  nk_tt_vertex **local_48;
  nk_handle *local_40;
  nk_tt_fontinfo *local_38;
  
  puVar6 = info->data;
  uVar12 = nk_tt__GetGlyfOffset(info,glyph_index);
  *pvertices = (nk_tt_vertex *)0x0;
  if ((int)uVar12 < 0) {
LAB_0014394e:
    uVar12 = 0;
  }
  else {
    uVar14 = (ulong)uVar12;
    uVar11 = CONCAT11(puVar6[uVar14],puVar6[uVar14 + 1]);
    local_48 = pvertices;
    if ((short)uVar11 < 1) {
      if (uVar11 == 0xffff) {
        vertices = (nk_tt_vertex *)0x0;
        uVar12 = 0;
        puVar15 = (ushort *)(puVar6 + uVar14 + 10);
        local_40 = &alloc->userdata;
        local_38 = info;
        do {
          comp_verts = (nk_tt_vertex *)0x0;
          bVar24 = *(byte *)((long)puVar15 + 1);
          if ((bVar24 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                          ,0x2c7e,
                          "int nk_tt_GetGlyphShape(const struct nk_tt_fontinfo *, struct nk_allocator *, int, struct nk_tt_vertex **)"
                         );
          }
          if ((bVar24 & 1) == 0) {
            iVar21 = (int)(char)puVar15[2];
            iVar18 = (int)((long)((ulong)*(byte *)((long)puVar15 + 5) << 0x38) >> 0x38);
            lVar23 = 6;
          }
          else {
            auVar9._9_7_ = 0;
            auVar9._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
            auVar8._10_6_ = 0;
            auVar8._0_10_ = SUB1610(auVar9 << 0x38,6);
            auVar7._11_5_ = 0;
            auVar7._0_11_ = SUB1611(auVar8 << 0x30,5);
            auVar10._1_12_ = SUB1612(auVar7 << 0x28,4);
            auVar10[0] = (char)puVar15[3];
            auVar10._13_3_ = 0;
            auVar34._1_14_ = SUB1614(auVar10 << 0x18,2);
            auVar34[0] = (char)puVar15[2];
            auVar34[0xf] = 0;
            auVar34 = ZEXT416((uint)*(byte *)((long)puVar15 + 7) << 0x10 |
                              (uint)*(byte *)((long)puVar15 + 5)) | auVar34 << 8;
            iVar21 = (int)auVar34._0_2_;
            iVar18 = (int)auVar34._2_2_;
            lVar23 = 8;
          }
          local_d8 = (ushort *)(lVar23 + (long)puVar15);
          if ((bVar24 & 8) == 0) {
            if ((bVar24 & 0x40) != 0) {
              puVar1 = local_d8 + 1;
              fVar36 = (float)(int)(short)(*local_d8 << 8 | *local_d8 >> 8) * 6.1035156e-05;
              local_d8 = local_d8 + 2;
              fVar35 = (float)(int)(short)(*puVar1 << 8 | *puVar1 >> 8) * 6.1035156e-05;
              goto LAB_001436ce;
            }
            if ((char)bVar24 < '\0') {
              fVar36 = (float)(int)CONCAT11((char)*local_d8,*(undefined1 *)((long)local_d8 + 1)) *
                       6.1035156e-05;
              fVar39 = (float)(int)((long)((ulong)CONCAT11((char)local_d8[2],
                                                           *(undefined1 *)((long)local_d8 + 5)) <<
                                          0x30) >> 0x30) * 6.1035156e-05;
              fVar32 = (float)(int)CONCAT11((char)local_d8[1],*(undefined1 *)((long)local_d8 + 3)) *
                       6.1035156e-05;
              fVar35 = (float)(int)((long)((ulong)CONCAT11((char)local_d8[3],
                                                           *(undefined1 *)((long)local_d8 + 7)) <<
                                          0x30) >> 0x30) * 6.1035156e-05;
              local_d8 = local_d8 + 4;
            }
            else {
              fVar36 = 1.0;
              fVar39 = 0.0;
              fVar32 = 0.0;
              fVar35 = 1.0;
            }
          }
          else {
            fVar36 = (float)(int)(short)(*local_d8 << 8 | *local_d8 >> 8) * 6.1035156e-05;
            local_d8 = local_d8 + 1;
            fVar35 = fVar36;
LAB_001436ce:
            fVar39 = 0.0;
            fVar32 = 0.0;
          }
          uStack_4c = 0;
          uStack_50 = 0;
          local_58 = CONCAT44(fVar39,fVar36);
          fVar37 = fVar36 * fVar36 + fVar32 * fVar32;
          fVar40 = fVar39 * fVar39 + fVar35 * fVar35;
          fVar36 = (float)(0x5f375a84 - ((uint)fVar37 >> 1));
          fVar39 = (float)(0x5f375a84 - ((uint)fVar40 >> 1));
          uVar17 = nk_tt_GetGlyphShape(info,alloc,(uint)(ushort)(puVar15[1] << 8 | puVar15[1] >> 8),
                                       &comp_verts);
          pnVar2 = comp_verts;
          if (0 < (int)uVar17) {
            fVar37 = fVar37 * (fVar37 * -0.5 * fVar36 * fVar36 + 1.5) * fVar36;
            fVar40 = fVar40 * (fVar40 * -0.5 * fVar39 * fVar39 + 1.5) * fVar39;
            nVar16 = 0;
            do {
              fVar36 = (float)(int)*(short *)((long)&comp_verts->x + nVar16);
              fVar39 = (float)(int)((long)((ulong)*(ushort *)((long)&comp_verts->cx + nVar16) <<
                                          0x30) >> 0x30);
              fVar38 = (float)(int)*(short *)((long)&comp_verts->y + nVar16);
              fVar41 = (float)(int)((long)((ulong)*(ushort *)((long)&comp_verts->cy + nVar16) <<
                                          0x30) >> 0x30);
              auVar33._0_4_ =
                   (int)((fVar38 * local_58._4_4_ + fVar36 * (float)local_58 + (float)iVar21) *
                        fVar37);
              auVar33._4_4_ = (int)((fVar38 * fVar35 + fVar36 * fVar32 + (float)iVar18) * fVar40);
              auVar33._8_4_ =
                   (int)((fVar41 * local_58._4_4_ + fVar39 * (float)local_58 + (float)iVar21) *
                        fVar37);
              auVar33._12_4_ = (int)((fVar41 * fVar35 + fVar39 * fVar32 + (float)iVar18) * fVar40);
              auVar34 = packssdw(auVar33,auVar33);
              *(long *)((long)&comp_verts->x + nVar16) = auVar34._0_8_;
              nVar16 = nVar16 + 10;
            } while ((ulong)uVar17 * 10 != nVar16);
            dst0 = (nk_tt_vertex *)
                   (*(code *)*(nk_handle *)((long)alloc + 8))
                             (alloc->userdata,(void *)0x0,(ulong)(uVar17 + uVar12) * 10);
            if (dst0 == (nk_tt_vertex *)0x0) {
              if (vertices != (nk_tt_vertex *)0x0) {
                (*(code *)*(nk_handle *)((long)alloc + 0x10))(alloc->userdata,vertices);
              }
              (*(code *)*(nk_handle *)((long)alloc + 0x10))(alloc->userdata,pnVar2);
              goto LAB_0014394e;
            }
            if (0 < (int)uVar12) {
              nk_memcopy(dst0,vertices,(ulong)uVar12 * 10);
            }
            nk_memcopy(dst0 + uVar12,pnVar2,(ulong)uVar17 * 10);
            alloc = (nk_allocator *)local_40;
            if (vertices != (nk_tt_vertex *)0x0) {
              (*(code *)local_40[2])(*local_40,vertices);
            }
            (*(code *)*(nk_handle *)((long)alloc + 0x10))(alloc->userdata,pnVar2);
            vertices = dst0;
            info = local_38;
            uVar12 = uVar17 + uVar12;
          }
          puVar15 = local_d8;
        } while ((bVar24 & 0x20) != 0);
      }
      else {
        if ((short)((ushort)puVar6[uVar14] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                        ,0x2cb5,
                        "int nk_tt_GetGlyphShape(const struct nk_tt_fontinfo *, struct nk_allocator *, int, struct nk_tt_vertex **)"
                       );
        }
        uVar12 = 0;
        vertices = (nk_tt_vertex *)0x0;
      }
    }
    else {
      uVar12 = (uint)uVar11 * 2;
      uVar19 = (ulong)uVar12;
      bVar24 = puVar6[uVar19 + uVar14 + 10];
      bVar26 = puVar6[uVar19 + uVar14 + 0xb];
      bVar3 = puVar6[uVar19 + uVar14 + 8];
      bVar4 = puVar6[uVar19 + uVar14 + 9];
      uVar17 = (uint)bVar4 + (uint)bVar3 * 0x100;
      local_58 = (ulong)uVar17;
      vertices = (nk_tt_vertex *)
                 (*alloc->alloc)(alloc->userdata,(void *)0x0,
                                 (ulong)((uVar17 + (uint)uVar11 * 2) * 10 + 10));
      if (vertices == (nk_tt_vertex *)0x0) {
        return 0;
      }
      puVar15 = (ushort *)(puVar6 + (ulong)bVar24 * 0x100 + (ulong)bVar26 + uVar19 + uVar14 + 0xc);
      uVar19 = uVar19 & 0xffff;
      local_d8._0_4_ = (uint)bVar4;
      iVar21 = (uint)bVar3 * 0x100 + (uint)local_d8;
      lVar23 = 0;
      bVar24 = 0;
      bVar26 = 0;
      do {
        if (bVar26 == 0) {
          bVar24 = (byte)*puVar15;
          if ((bVar24 & 8) == 0) {
            puVar15 = (ushort *)((long)puVar15 + 1);
            bVar26 = 0;
          }
          else {
            bVar26 = *(byte *)((long)puVar15 + 1);
            puVar15 = puVar15 + 1;
          }
        }
        else {
          bVar26 = bVar26 - 1;
        }
        (&vertices[uVar19].type)[lVar23] = bVar24;
        lVar23 = lVar23 + 10;
      } while ((ulong)(iVar21 * 2 + 2) * 5 != lVar23);
      lVar23 = 0;
      sVar25 = 0;
      do {
        bVar24 = (&vertices[uVar19].type)[lVar23];
        if ((bVar24 & 2) == 0) {
          if ((bVar24 & 0x10) == 0) {
            sVar25 = sVar25 + (*puVar15 << 8 | *puVar15 >> 8);
            puVar15 = puVar15 + 1;
          }
        }
        else {
          uVar11 = *puVar15;
          puVar15 = (ushort *)((long)puVar15 + 1);
          uVar27 = -(ushort)(byte)uVar11;
          if ((bVar24 & 0x10) != 0) {
            uVar27 = (ushort)(byte)uVar11;
          }
          sVar25 = sVar25 + uVar27;
        }
        *(short *)((long)&vertices[uVar19].x + lVar23) = sVar25;
        lVar23 = lVar23 + 10;
      } while ((ulong)(iVar21 * 2 + 2) * 5 != lVar23);
      lVar23 = 0;
      sVar25 = 0;
      do {
        bVar24 = (&vertices[uVar19].type)[lVar23];
        if ((bVar24 & 4) == 0) {
          if ((bVar24 & 0x20) == 0) {
            sVar25 = sVar25 + (*puVar15 << 8 | *puVar15 >> 8);
            puVar15 = puVar15 + 1;
          }
        }
        else {
          uVar11 = *puVar15;
          puVar15 = (ushort *)((long)puVar15 + 1);
          uVar27 = -(ushort)(byte)uVar11;
          if ((bVar24 & 0x20) != 0) {
            uVar27 = (ushort)(byte)uVar11;
          }
          sVar25 = sVar25 + uVar27;
        }
        *(short *)((long)&vertices[uVar19].y + lVar23) = sVar25;
        lVar23 = lVar23 + 10;
      } while ((ulong)(iVar21 * 2 + 2) * 5 != lVar23);
      num_vertices = 0;
      iVar21 = 0;
      iVar18 = 0;
      iVar13 = 0;
      nVar29 = 0;
      nVar31 = 0;
      sy = 0;
      sx = 0;
      cy = 0;
      cx = 0;
      uVar17 = 0;
      was_off = 0;
      do {
        lVar23 = (long)(int)(uVar12 + iVar21);
        bVar24 = vertices[lVar23].type;
        sVar25 = vertices[lVar23].x;
        sVar5 = vertices[lVar23].y;
        iVar30 = (int)sVar25;
        iVar28 = (int)sVar5;
        if (iVar13 == iVar21) {
          if (iVar21 != 0) {
            num_vertices = nk_tt__close_shape(vertices,num_vertices,was_off,uVar17,sx,sy,nVar31,
                                              nVar29,cx,cy);
          }
          sx = iVar30;
          sy = iVar28;
          if ((bVar24 & 1) == 0) {
            nVar31 = iVar30;
            nVar29 = iVar28;
            if ((vertices[lVar23 + 1].type & 1) == 0) {
              sx = vertices[lVar23 + 1].x + iVar30 >> 1;
              sy = vertices[lVar23 + 1].y + iVar28 >> 1;
            }
            else {
              iVar21 = iVar21 + 1;
              sx = (int)vertices[lVar23 + 1].x;
              sy = (int)vertices[lVar23 + 1].y;
            }
          }
          uVar17 = bVar24 & 1 ^ 1;
          vertices[num_vertices].type = '\x01';
          vertices[num_vertices].x = (short)sx;
          vertices[num_vertices].y = (short)sy;
          vertices[num_vertices].cx = 0;
          vertices[num_vertices].cy = 0;
          iVar13 = (ushort)(*(ushort *)(puVar6 + (long)iVar18 * 2 + uVar14 + 10) << 8 |
                           *(ushort *)(puVar6 + (long)iVar18 * 2 + uVar14 + 10) >> 8) + 1;
          iVar18 = iVar18 + 1;
          was_off = 0;
          iVar22 = iVar21;
          num_vertices = num_vertices + 1;
        }
        else {
          sVar20 = (short)cy;
          iVar22 = iVar21;
          if ((bVar24 & 1) == 0) {
            iVar21 = num_vertices;
            if (was_off != 0) {
              iVar21 = num_vertices + 1;
              vertices[num_vertices].type = '\x03';
              vertices[num_vertices].x = (short)((uint)(cx + iVar30) >> 1);
              vertices[num_vertices].y = (short)((uint)(cy + iVar28) >> 1);
              vertices[num_vertices].cx = (short)cx;
              vertices[num_vertices].cy = sVar20;
            }
            was_off = 1;
            num_vertices = iVar21;
            cx = iVar30;
            cy = iVar28;
          }
          else {
            pnVar2 = vertices + num_vertices;
            if (was_off == 0) {
              pnVar2->type = '\x02';
              pnVar2->x = sVar25;
              pnVar2->y = sVar5;
              pnVar2->cx = 0;
              sVar20 = 0;
            }
            else {
              pnVar2->type = '\x03';
              pnVar2->x = sVar25;
              pnVar2->y = sVar5;
              pnVar2->cx = (short)cx;
            }
            pnVar2->cy = sVar20;
            num_vertices = num_vertices + 1;
            was_off = 0;
          }
        }
        iVar21 = iVar22 + 1;
      } while (iVar22 < (int)(float)local_58);
      uVar12 = nk_tt__close_shape(vertices,num_vertices,was_off,uVar17,sx,sy,nVar31,nVar29,cx,cy);
    }
    *local_48 = vertices;
  }
  return uVar12;
}

Assistant:

NK_INTERN int
nk_tt_GetGlyphShape(const struct nk_tt_fontinfo *info, struct nk_allocator *alloc,
    int glyph_index, struct nk_tt_vertex **pvertices)
{
    nk_short numberOfContours;
    const nk_byte *endPtsOfContours;
    const nk_byte *data = info->data;
    struct nk_tt_vertex *vertices=0;
    int num_vertices=0;
    int g = nk_tt__GetGlyfOffset(info, glyph_index);
    *pvertices = 0;

    if (g < 0) return 0;
    numberOfContours = nk_ttSHORT(data + g);
    if (numberOfContours > 0) {
        nk_byte flags=0,flagcount;
        nk_int ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
        nk_int x,y,cx,cy,sx,sy, scx,scy;
        const nk_byte *points;
        endPtsOfContours = (data + g + 10);
        ins = nk_ttUSHORT(data + g + 10 + numberOfContours * 2);
        points = data + g + 10 + numberOfContours * 2 + 2 + ins;

        n = 1+nk_ttUSHORT(endPtsOfContours + numberOfContours*2-2);
        m = n + 2*numberOfContours;  /* a loose bound on how many vertices we might need */
        vertices = (struct nk_tt_vertex *)alloc->alloc(alloc->userdata, 0, (nk_size)m * sizeof(vertices[0]));
        if (vertices == 0)
            return 0;

        next_move = 0;
        flagcount=0;

        /* in first pass, we load uninterpreted data into the allocated array */
        /* above, shifted to the end of the array so we won't overwrite it when */
        /* we create our final data starting from the front */
        off = m - n; /* starting offset for uninterpreted data, regardless of how m ends up being calculated */

        /* first load flags */
        for (i=0; i < n; ++i) {
            if (flagcount == 0) {
                flags = *points++;
                if (flags & 8)
                    flagcount = *points++;
            } else --flagcount;
            vertices[off+i].type = flags;
        }

        /* now load x coordinates */
        x=0;
        for (i=0; i < n; ++i) {
            flags = vertices[off+i].type;
            if (flags & 2) {
                nk_short dx = *points++;
                x += (flags & 16) ? dx : -dx; /* ??? */
            } else {
                if (!(flags & 16)) {
                    x = x + (nk_short) (points[0]*256 + points[1]);
                    points += 2;
                }
            }
            vertices[off+i].x = (nk_short) x;
        }

        /* now load y coordinates */
        y=0;
        for (i=0; i < n; ++i) {
            flags = vertices[off+i].type;
            if (flags & 4) {
                nk_short dy = *points++;
                y += (flags & 32) ? dy : -dy; /* ??? */
            } else {
                if (!(flags & 32)) {
                    y = y + (nk_short) (points[0]*256 + points[1]);
                    points += 2;
                }
            }
            vertices[off+i].y = (nk_short) y;
        }

        /* now convert them to our format */
        num_vertices=0;
        sx = sy = cx = cy = scx = scy = 0;
        for (i=0; i < n; ++i)
        {
            flags = vertices[off+i].type;
            x     = (nk_short) vertices[off+i].x;
            y     = (nk_short) vertices[off+i].y;

            if (next_move == i) {
                if (i != 0)
                    num_vertices = nk_tt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

                /* now start the new one                */
                start_off = !(flags & 1);
                if (start_off) {
                    /* if we start off with an off-curve point, then when we need to find a point on the curve */
                    /* where we can start, and we need to save some state for when we wraparound. */
                    scx = x;
                    scy = y;
                    if (!(vertices[off+i+1].type & 1)) {
                        /* next point is also a curve point, so interpolate an on-point curve */
                        sx = (x + (nk_int) vertices[off+i+1].x) >> 1;
                        sy = (y + (nk_int) vertices[off+i+1].y) >> 1;
                    } else {
                        /* otherwise just use the next point as our start point */
                        sx = (nk_int) vertices[off+i+1].x;
                        sy = (nk_int) vertices[off+i+1].y;
                        ++i; /* we're using point i+1 as the starting point, so skip it */
                    }
                } else {
                    sx = x;
                    sy = y;
                }
                nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vmove,sx,sy,0,0);
                was_off = 0;
                next_move = 1 + nk_ttUSHORT(endPtsOfContours+j*2);
                ++j;
            } else {
                if (!(flags & 1))
                { /* if it's a curve */
                    if (was_off) /* two off-curve control points in a row means interpolate an on-curve midpoint */
                        nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
                    cx = x;
                    cy = y;
                    was_off = 1;
                } else {
                    if (was_off)
                        nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve, x,y, cx, cy);
                    else nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vline, x,y,0,0);
                    was_off = 0;
                }
            }
        }
        num_vertices = nk_tt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
    } else if (numberOfContours == -1) {
        /* Compound shapes. */
        int more = 1;
        const nk_byte *comp = data + g + 10;
        num_vertices = 0;
        vertices = 0;

        while (more)
        {
            nk_ushort flags, gidx;
            int comp_num_verts = 0, i;
            struct nk_tt_vertex *comp_verts = 0, *tmp = 0;
            float mtx[6] = {1,0,0,1,0,0}, m, n;

            flags = (nk_ushort)nk_ttSHORT(comp); comp+=2;
            gidx = (nk_ushort)nk_ttSHORT(comp); comp+=2;

            if (flags & 2) { /* XY values */
                if (flags & 1) { /* shorts */
                    mtx[4] = nk_ttSHORT(comp); comp+=2;
                    mtx[5] = nk_ttSHORT(comp); comp+=2;
                } else {
                    mtx[4] = nk_ttCHAR(comp); comp+=1;
                    mtx[5] = nk_ttCHAR(comp); comp+=1;
                }
            } else {
                /* @TODO handle matching point */
                NK_ASSERT(0);
            }
            if (flags & (1<<3)) { /* WE_HAVE_A_SCALE */
                mtx[0] = mtx[3] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[1] = mtx[2] = 0;
            } else if (flags & (1<<6)) { /* WE_HAVE_AN_X_AND_YSCALE */
                mtx[0] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[1] = mtx[2] = 0;
                mtx[3] = nk_ttSHORT(comp)/16384.0f; comp+=2;
            } else if (flags & (1<<7)) { /* WE_HAVE_A_TWO_BY_TWO */
                mtx[0] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[1] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[2] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[3] = nk_ttSHORT(comp)/16384.0f; comp+=2;
            }

             /* Find transformation scales. */
            m = (float) NK_SQRT(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
            n = (float) NK_SQRT(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

             /* Get indexed glyph. */
            comp_num_verts = nk_tt_GetGlyphShape(info, alloc, gidx, &comp_verts);
            if (comp_num_verts > 0)
            {
                /* Transform vertices. */
                for (i = 0; i < comp_num_verts; ++i) {
                    struct nk_tt_vertex* v = &comp_verts[i];
                    short x,y;
                    x=v->x; y=v->y;
                    v->x = (short)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
                    v->y = (short)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
                    x=v->cx; y=v->cy;
                    v->cx = (short)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
                    v->cy = (short)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
                }
                /* Append vertices. */
                tmp = (struct nk_tt_vertex*)alloc->alloc(alloc->userdata, 0,
                    (nk_size)(num_vertices+comp_num_verts)*sizeof(struct nk_tt_vertex));
                if (!tmp) {
                    if (vertices) alloc->free(alloc->userdata, vertices);
                    if (comp_verts) alloc->free(alloc->userdata, comp_verts);
                    return 0;
                }
                if (num_vertices > 0) NK_MEMCPY(tmp, vertices, (nk_size)num_vertices*sizeof(struct nk_tt_vertex));
                NK_MEMCPY(tmp+num_vertices, comp_verts, (nk_size)comp_num_verts*sizeof(struct nk_tt_vertex));
                if (vertices) alloc->free(alloc->userdata,vertices);
                vertices = tmp;
                alloc->free(alloc->userdata,comp_verts);
                num_vertices += comp_num_verts;
            }
            /* More components ? */
            more = flags & (1<<5);
        }
    } else if (numberOfContours < 0) {
        /* @TODO other compound variations? */
        NK_ASSERT(0);
    } else {
        /* numberOfCounters == 0, do nothing */
    }
    *pvertices = vertices;
    return num_vertices;
}